

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_node::append_buffer
          (xml_node *this,void *contents,size_t size,uint options,xml_encoding encoding)

{
  bool bVar1;
  xml_node_type xVar2;
  xml_document_struct *contents_00;
  xml_extra_buffer *pxVar3;
  xml_encoding in_EDX;
  xml_node *in_RSI;
  xml_parse_result *in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  char_t **in_stack_00000008;
  name_null_sentry sentry;
  xml_extra_buffer *extra;
  xml_memory_page *page;
  xml_document_struct *doc;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  size_t in_stack_ffffffffffffff70;
  xml_allocator *in_stack_ffffffffffffff78;
  name_null_sentry local_50;
  size_t size_00;
  xml_node in_stack_ffffffffffffffd8;
  
  xVar2 = type(in_RSI);
  bVar1 = impl::anon_unknown_0::allow_insert_child(xVar2,node_element);
  if (bVar1) {
    bVar1 = false;
    if ((in_R8D & 0x4000) != 0) {
      in_stack_ffffffffffffffd8 =
           last_child((xml_node *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      xVar2 = type((xml_node *)&stack0xffffffffffffffd8);
      bVar1 = xVar2 == node_pcdata;
    }
    if (bVar1) {
      impl::anon_unknown_0::make_parse_result
                ((xml_parse_status)(in_stack_ffffffffffffff70 >> 0x20),
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      contents_00 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(in_RSI->_root);
      (contents_00->super_xml_node_struct).header =
           (contents_00->super_xml_node_struct).header | 0x40;
      size_00 = 0;
      pxVar3 = (xml_extra_buffer *)
               impl::anon_unknown_0::xml_allocator::allocate_memory
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          (xml_memory_page **)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (pxVar3 == (xml_extra_buffer *)0x0) {
        impl::anon_unknown_0::make_parse_result
                  ((xml_parse_status)(in_stack_ffffffffffffff70 >> 0x20),
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else {
        pxVar3->buffer = (char_t *)0x0;
        pxVar3->next = contents_00->extra_buffers;
        contents_00->extra_buffers = pxVar3;
        impl::anon_unknown_0::name_null_sentry::name_null_sentry(&local_50,in_RSI->_root);
        impl::anon_unknown_0::load_buffer_impl
                  ((xml_document_struct *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd8._root,
                   contents_00,size_00,(uint)((ulong)pxVar3 >> 0x20),in_EDX,
                   SUB81((ulong)pxVar3 >> 0x18,0),SUB81((ulong)pxVar3 >> 0x10,0),in_stack_00000008);
        impl::anon_unknown_0::name_null_sentry::~name_null_sentry(&local_50);
      }
    }
  }
  else {
    impl::anon_unknown_0::make_parse_result
              ((xml_parse_status)(in_stack_ffffffffffffff70 >> 0x20),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_node::append_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		// append_buffer is only valid for elements/documents
		if (!impl::allow_insert_child(type(), node_element)) return impl::make_parse_result(status_append_invalid_root);

		// append buffer can not merge PCDATA into existing PCDATA nodes
		if ((options & parse_merge_pcdata) != 0 && last_child().type() == node_pcdata) return impl::make_parse_result(status_append_invalid_root);

		// get document node
		impl::xml_document_struct* doc = &impl::get_document(_root);

		// disable document_buffer_order optimization since in a document with multiple buffers comparing buffer pointers does not make sense
		doc->header |= impl::xml_memory_page_contents_shared_mask;

		// get extra buffer element (we'll store the document fragment buffer there so that we can deallocate it later)
		impl::xml_memory_page* page = NULL;
		impl::xml_extra_buffer* extra = static_cast<impl::xml_extra_buffer*>(doc->allocate_memory(sizeof(impl::xml_extra_buffer) + sizeof(void*), page));
		(void)page;

		if (!extra) return impl::make_parse_result(status_out_of_memory);

	#ifdef PUGIXML_COMPACT
		// align the memory block to a pointer boundary; this is required for compact mode where memory allocations are only 4b aligned
		// note that this requires up to sizeof(void*)-1 additional memory, which the allocation above takes into account
		extra = reinterpret_cast<impl::xml_extra_buffer*>((reinterpret_cast<uintptr_t>(extra) + (sizeof(void*) - 1)) & ~(sizeof(void*) - 1));
	#endif

		// add extra buffer to the list
		extra->buffer = NULL;
		extra->next = doc->extra_buffers;
		doc->extra_buffers = extra;

		// name of the root has to be NULL before parsing - otherwise closing node mismatches will not be detected at the top level
		impl::name_null_sentry sentry(_root);

		return impl::load_buffer_impl(doc, _root, const_cast<void*>(contents), size, options, encoding, false, false, &extra->buffer);
	}